

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsavefile.cpp
# Opt level: O2

void __thiscall QSaveFile::cancelWriting(QSaveFile *this)

{
  QFileDevicePrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFileDevicePrivate *)(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  bVar1 = QIODevice::isOpen((QIODevice *)this);
  if (bVar1) {
    tr((QString *)&local_30,"Writing canceled by application",(char *)0x0,-1);
    QFileDevicePrivate::setError(this_00,WriteError,(QString *)&local_30);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
    *(undefined4 *)
     &this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.field_0x30 = 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSaveFile::cancelWriting()
{
    Q_D(QSaveFile);
    if (!isOpen())
        return;
    d->setError(QFileDevice::WriteError, QSaveFile::tr("Writing canceled by application"));
    d->writeError = QFileDevice::WriteError;
}